

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O1

Expression * soul::ExpressionHelpers::createPrimitive(Expression *__return_storage_ptr__,string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Section local_60;
  
  paVar2 = &local_60.text.field_2;
  local_60.type = primitive;
  local_60.text._M_dataplus._M_p = (s->_M_dataplus)._M_p;
  paVar1 = &s->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.text._M_dataplus._M_p == paVar1) {
    local_60.text.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_60.text.field_2._8_8_ = *(undefined8 *)((long)&s->field_2 + 8);
    local_60.text._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_60.text.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_60.text._M_string_length = s->_M_string_length;
  paVar3 = &local_60.referencedUID.field_2;
  (s->_M_dataplus)._M_p = (pointer)paVar1;
  s->_M_string_length = 0;
  (s->field_2)._M_local_buf[0] = '\0';
  local_60.referencedUID._M_string_length = 0;
  local_60.referencedUID.field_2._M_local_buf[0] = '\0';
  local_60.referencedUID._M_dataplus._M_p = (pointer)paVar3;
  fromSection(__return_storage_ptr__,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.referencedUID._M_dataplus._M_p != paVar3) {
    operator_delete(local_60.referencedUID._M_dataplus._M_p,
                    CONCAT71(local_60.referencedUID.field_2._M_allocated_capacity._1_7_,
                             local_60.referencedUID.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.text._M_dataplus._M_p != paVar2) {
    operator_delete(local_60.text._M_dataplus._M_p,local_60.text.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Expression createPrimitive    (std::string s) { return fromSection ({ SourceCodeModel::Expression::Section::Type::primitive,  std::move (s) }); }